

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool MultiplicationHelper<int,_int,_1>::Multiply(int *t,int *u,int *ret)

{
  code *pcVar1;
  int iVar2;
  long lVar3;
  undefined4 *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int64_t tmp;
  
  lVar3 = (long)*in_RDI * (long)*in_RSI;
  if (SEXT816(lVar3) != SEXT816((long)*in_RDI) * SEXT816((long)*in_RSI)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  iVar2 = std::numeric_limits<int>::max();
  if ((lVar3 <= iVar2) && (iVar2 = std::numeric_limits<int>::min(), iVar2 <= lVar3)) {
    *in_RDX = (int)lVar3;
    return true;
  }
  return false;
}

Assistant:

static bool Multiply( const T& t, const U& u, T& ret ) SAFEINT_NOTHROW
    {
        std::int64_t tmp = (std::int64_t)t * (std::int64_t)u;

        if(tmp > (std::int64_t)std::numeric_limits<T>::max() || tmp < (std::int64_t)std::numeric_limits<T>::min())
            return false;

        ret = (T)tmp;
        return true;
    }